

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_transformUnbounded(SoPlexBase<double> *this)

{
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  RangeType *pRVar4;
  Rational *pRVar5;
  double *pdVar6;
  SoPlexBase<double> *in_RDI;
  Real RVar7;
  int c_1;
  DSVectorRational obj;
  int numOrigCols;
  int r_1;
  int r;
  int c;
  Verbosity old_verbosity;
  undefined4 in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  SoPlexBase<double> *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  int in_stack_fffffffffffff72c;
  uint uVar8;
  LPRowBase<double> *in_stack_fffffffffffff730;
  double dVar9;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffff740;
  SPxLPRational *pSVar10;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff750;
  SPxLPBase<double> *pSVar11;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff760;
  double *in_stack_fffffffffffff768;
  SPxLPRational *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  uint in_stack_fffffffffffff77c;
  undefined8 in_stack_fffffffffffff7b0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff7b8;
  Real local_750 [2];
  undefined4 local_73c;
  undefined1 local_738 [72];
  Real local_6f0 [2];
  undefined4 local_6dc;
  undefined1 local_6d8 [64];
  undefined8 local_698;
  undefined4 local_68c;
  undefined1 local_688 [64];
  uint local_648;
  undefined4 local_644;
  undefined8 local_640;
  Real local_638;
  undefined4 local_62c;
  undefined1 local_628 [64];
  undefined8 local_5e8;
  undefined4 local_5dc;
  undefined1 local_5d8 [68];
  undefined4 local_594;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_560;
  undefined1 local_558 [60];
  undefined4 local_51c;
  undefined1 local_518 [76];
  undefined4 local_4cc;
  undefined1 local_4c8 [76];
  undefined4 local_47c;
  undefined1 local_478 [64];
  undefined1 local_438 [236];
  undefined4 local_34c;
  undefined1 local_348 [100];
  uint local_2e4;
  Real local_2e0 [2];
  undefined4 local_2cc;
  undefined1 local_2c8 [72];
  Real local_280 [4];
  undefined4 local_25c;
  undefined1 local_258 [68];
  uint local_214;
  int local_210;
  int local_20c;
  Verbosity local_208;
  Verbosity local_204 [3];
  Rational *local_1f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1f0;
  Rational *local_1e8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1e0;
  Rational *local_1d8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1d0;
  Rational *local_1c8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined4 *local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 *local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 *local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined4 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 *local_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 *local_108;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 *local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 *local_68;
  undefined1 *local_60;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined4 *local_8;
  
  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
    local_204[0] = SPxOut::getVerbosity(&in_RDI->spxout);
    local_208 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_208);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffff720,
                       (char *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    SPxOut::setVerbosity(&in_RDI->spxout,local_204);
  }
  (*in_RDI->_statistics->transformTime->_vptr_Timer[3])();
  numColsRational((SoPlexBase<double> *)0x47c5dc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x18,0));
  numColsRational((SoPlexBase<double> *)0x47c60e);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x18,0));
  local_20c = numColsRational((SoPlexBase<double> *)0x47c62f);
  while (local_20c = local_20c + -1, -1 < local_20c) {
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_20c);
    bVar1 = _lowerFinite(in_RDI,pRVar4);
    if (bVar1) {
      pRVar5 = lowerRational(in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1c8 = pRVar5;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff720,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    }
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_20c);
    bVar1 = _upperFinite(in_RDI,pRVar4);
    if (bVar1) {
      pRVar5 = upperRational(in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1d8 = pRVar5;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff720,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    }
  }
  numRowsRational((SoPlexBase<double> *)0x47c7ad);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x18,0));
  numRowsRational((SoPlexBase<double> *)0x47c7df);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(in_stack_fffffffffffff7b8,(int)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff7b0 >> 0x18,0));
  local_210 = numRowsRational((SoPlexBase<double> *)0x47c800);
  while (local_210 = local_210 + -1, -1 < local_210) {
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_210);
    bVar1 = _lowerFinite(in_RDI,pRVar4);
    if (bVar1) {
      pRVar5 = lhsRational(in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1e8 = pRVar5;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff720,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    }
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_210);
    bVar1 = _upperFinite(in_RDI,pRVar4);
    if (bVar1) {
      pRVar5 = rhsRational(in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      local_1f8 = pRVar5;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)in_stack_fffffffffffff720,
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    }
  }
  local_214 = numRowsRational((SoPlexBase<double> *)0x47c96d);
  while (local_214 = local_214 - 1, -1 < (int)local_214) {
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_214);
    bVar1 = _lowerFinite(in_RDI,pRVar4);
    uVar8 = local_214;
    if (bVar1) {
      pSVar10 = in_RDI->_rationalLP;
      local_25c = 0;
      local_1a8 = &local_25c;
      local_1b0 = 0;
      local_1b8 = 0;
      local_1a0 = local_258;
      local_8 = local_1a8;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                 (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      (*(pSVar10->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x33])(pSVar10,(ulong)uVar8,local_258,0);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x47ca99);
      local_280[1] = 0.0;
      (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                (in_RDI->_realLP,(ulong)local_214,local_280 + 1,0);
    }
    else {
      pdVar6 = SPxLPBase<double>::lhs
                         ((SPxLPBase<double> *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      dVar9 = *pdVar6;
      RVar7 = realParam(in_RDI,INFTY);
      uVar8 = local_214;
      if (-RVar7 < dVar9) {
        pSVar11 = in_RDI->_realLP;
        local_280[0] = realParam(in_RDI,INFTY);
        local_280[0] = -local_280[0];
        (*(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                  (pSVar11,(ulong)uVar8,local_280,0);
      }
    }
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_rowTypes,local_214);
    bVar1 = _upperFinite(in_RDI,pRVar4);
    uVar8 = local_214;
    if (bVar1) {
      pSVar10 = in_RDI->_rationalLP;
      local_2cc = 0;
      local_188 = &local_2cc;
      local_190 = 0;
      local_198 = 0;
      local_180 = local_2c8;
      local_10 = local_188;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                 (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      (*(pSVar10->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x36])(pSVar10,(ulong)uVar8,local_2c8,0);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x47cce3);
      local_2e0[1] = 0.0;
      (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                (in_RDI->_realLP,(ulong)local_214,local_2e0 + 1,0);
    }
    else {
      pdVar6 = SPxLPBase<double>::rhs
                         ((SPxLPBase<double> *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      dVar9 = *pdVar6;
      RVar7 = realParam(in_RDI,INFTY);
      uVar8 = local_214;
      if (dVar9 < RVar7) {
        pSVar11 = in_RDI->_realLP;
        local_2e0[0] = realParam(in_RDI,INFTY);
        (*(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                  (pSVar11,(ulong)uVar8,local_2e0,0);
      }
    }
  }
  local_2e4 = numColsRational((SoPlexBase<double> *)0x47ce0d);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            *)0x47ce3e);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
  ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffff720,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  local_34c = 0xffffffff;
  local_160 = local_348;
  local_168 = &local_34c;
  local_170 = 0;
  local_178 = 0xffffffffffffffff;
  local_18 = local_168;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
         *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c,
        (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
         *)in_stack_fffffffffffff720);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47cf0f);
  pSVar10 = in_RDI->_rationalLP;
  local_47c = 0;
  local_140 = local_478;
  local_148 = &local_47c;
  local_150 = 0;
  local_158 = 0;
  local_20 = local_148;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  local_4cc = 0;
  local_120 = local_4c8;
  local_128 = &local_4cc;
  local_130 = 0;
  local_138 = 0;
  local_28 = local_128;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  local_51c = 0;
  local_100 = local_518;
  local_108 = &local_51c;
  local_110 = 0;
  local_118 = 0;
  local_30 = local_108;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase(in_stack_fffffffffffff760,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
              in_stack_fffffffffffff750,
              (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
              in_stack_fffffffffffff740);
  (*(pSVar10->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[5])(pSVar10,local_438,0);
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_stack_fffffffffffff720);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47d101);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47d10e);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47d11b);
  pSVar11 = in_RDI->_realLP;
  local_560 = 0;
  DSVectorBase<double>::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
            ((DSVectorBase<double> *)in_stack_fffffffffffff720,
             (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  local_588 = 0;
  local_590 = 0;
  LPRowBase<double>::LPRowBase
            (in_stack_fffffffffffff730,
             (double *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (SVectorBase<double> *)in_stack_fffffffffffff720,
             (double *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718),
             (double *)0x47d19a);
  (*(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[5])(pSVar11,local_558,0);
  LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x47d1c6);
  DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_fffffffffffff720);
  local_594 = 4;
  DataArray<soplex::SoPlexBase<double>::RangeType>::append
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_fffffffffffff720,
             (RangeType *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  uVar8 = local_2e4;
  pSVar10 = in_RDI->_rationalLP;
  local_5dc = 1;
  local_e0 = local_5d8;
  local_e8 = &local_5dc;
  local_f0 = 0;
  local_f8 = 1;
  local_38 = local_e8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  (*(pSVar10->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x27])(pSVar10,(ulong)uVar8,local_5d8,0);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47d2cc);
  local_5e8 = 0x3ff0000000000000;
  (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x27])
            (in_RDI->_realLP,(ulong)local_2e4,&local_5e8,0);
  uVar8 = local_2e4;
  pSVar10 = in_RDI->_rationalLP;
  pRVar5 = &in_RDI->_rationalNegInfty;
  local_62c = 1;
  local_c0 = local_628;
  local_c8 = &local_62c;
  local_d0 = 0;
  local_d8 = 1;
  local_40 = local_c8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
             (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  (*(pSVar10->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._vptr_ClassArray[0x30])(pSVar10,(ulong)uVar8,pRVar5,local_628,0);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x47d3f1);
  uVar8 = local_2e4;
  pSVar11 = in_RDI->_realLP;
  local_638 = realParam(in_RDI,INFTY);
  local_638 = -local_638;
  local_640 = 0x3ff0000000000000;
  (*(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x30])
            (pSVar11,(ulong)uVar8,&local_638,&local_640,0);
  local_644 = 2;
  DataArray<soplex::SoPlexBase<double>::RangeType>::append
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_fffffffffffff720,
             (RangeType *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  iVar3 = numColsRational((SoPlexBase<double> *)0x47d4a6);
  for (local_648 = iVar3 - 2; uVar8 = local_648, -1 < (int)local_648; local_648 = local_648 - 1) {
    pSVar10 = in_RDI->_rationalLP;
    local_68c = 0;
    local_a0 = local_688;
    local_a8 = &local_68c;
    local_b0 = 0;
    local_b8 = 0;
    local_48 = local_a8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
               (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    (*(pSVar10->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._vptr_ClassArray[0x24])(pSVar10,(ulong)uVar8,local_688,0);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x47d58c);
    local_698 = 0;
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x24])
              (in_RDI->_realLP,(ulong)local_648,&local_698);
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_648);
    bVar1 = _lowerFinite(in_RDI,pRVar4);
    if (bVar1) {
      in_stack_fffffffffffff770 = in_RDI->_rationalLP;
      local_6dc = 0;
      local_80 = local_6d8;
      local_88 = &local_6dc;
      local_90 = 0;
      local_98 = 0;
      in_stack_fffffffffffff77c = local_648;
      local_50 = local_88;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)CONCAT44(local_648,in_stack_fffffffffffff778),
                 (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      (*(in_stack_fffffffffffff770->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x2a])
                (in_stack_fffffffffffff770,(ulong)in_stack_fffffffffffff77c,local_6d8);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x47d6be);
      local_6f0[1] = 0.0;
      (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                (in_RDI->_realLP,(ulong)local_648,local_6f0 + 1);
    }
    else {
      in_stack_fffffffffffff768 =
           SPxLPBase<double>::lower
                     ((SPxLPBase<double> *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      dVar9 = *in_stack_fffffffffffff768;
      RVar7 = realParam(in_RDI,INFTY);
      if (-RVar7 < dVar9) {
        pSVar11 = in_RDI->_realLP;
        uVar8 = local_648;
        local_6f0[0] = realParam(in_RDI,INFTY);
        local_6f0[0] = -local_6f0[0];
        (*(pSVar11->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                  (pSVar11,(ulong)uVar8,local_6f0);
      }
    }
    pRVar4 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                       (&in_RDI->_colTypes,local_648);
    bVar1 = _upperFinite(in_RDI,pRVar4);
    if (bVar1) {
      pSVar10 = in_RDI->_rationalLP;
      local_73c = 0;
      local_60 = local_738;
      local_68 = &local_73c;
      local_70 = 0;
      local_78 = 0;
      uVar8 = local_648;
      local_58 = local_68;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::rational_adaptor<long_long>
                ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                 (longlong *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      (*(pSVar10->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._vptr_ClassArray[0x2d])(pSVar10,(ulong)uVar8,local_738);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x47da6f);
      local_750[1] = 0.0;
      (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])
                (in_RDI->_realLP,(ulong)local_648,local_750 + 1);
    }
    else {
      pdVar6 = SPxLPBase<double>::upper
                         ((SPxLPBase<double> *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
      dVar9 = *pdVar6;
      RVar7 = realParam(in_RDI,INFTY);
      if (dVar9 < RVar7) {
        in_stack_fffffffffffff720 = (SoPlexBase<double> *)in_RDI->_realLP;
        uVar8 = local_648;
        local_750[0] = realParam(in_RDI,INFTY);
        (*(((LPRowSetBase<double> *)&in_stack_fffffffffffff720->_vptr_SoPlexBase)->
          super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d]
        )(in_stack_fffffffffffff720,(ulong)uVar8,local_750);
      }
    }
  }
  if ((in_RDI->_hasBasis & 1U) != 0) {
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff720,
               (VarStatus *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::append
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff720,
               (VarStatus *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    SLUFactorRational::clear((SLUFactorRational *)in_stack_fffffffffffff720);
  }
  (*in_RDI->_statistics->transformTime->_vptr_Timer[4])();
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffff720);
  return;
}

Assistant:

void SoPlexBase<R>::_transformUnbounded()
{
   SPX_MSG_INFO1(spxout, spxout << "Setting up LP to compute primal unbounded ray.\n");

   // start timing
   _statistics->transformTime->start();

   // print LP if in debug mode
   SPX_DEBUG(_realLP->writeFileLPBase("beforeTransUnbounded.lp", 0, 0, 0));

   // store bounds
   _unboundedLower.reDim(numColsRational());
   _unboundedUpper.reDim(numColsRational());

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_lowerFinite(_colTypes[c]))
         _unboundedLower[c] = lowerRational(c);

      if(_upperFinite(_colTypes[c]))
         _unboundedUpper[c] = upperRational(c);
   }

   // store sides
   _unboundedLhs.reDim(numRowsRational());
   _unboundedRhs.reDim(numRowsRational());

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      if(_lowerFinite(_rowTypes[r]))
         _unboundedLhs[r] = lhsRational(r);

      if(_upperFinite(_rowTypes[r]))
         _unboundedRhs[r] = rhsRational(r);
   }

   // make right-hand side zero
   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      assert((lhsRational(r) > _rationalNegInfty) == _lowerFinite(_rowTypes[r]));

      if(_lowerFinite(_rowTypes[r]))
      {
         _rationalLP->changeLhs(r, Rational(0));
         _realLP->changeLhs(r, R(0.0));
      }
      else if(_realLP->lhs(r) > -realParam(SoPlexBase<R>::INFTY))
         _realLP->changeLhs(r, -realParam(SoPlexBase<R>::INFTY));

      assert((rhsRational(r) < _rationalPosInfty) == _upperFinite(_rowTypes[r]));

      if(_upperFinite(_rowTypes[r]))
      {
         _rationalLP->changeRhs(r, Rational(0));
         _realLP->changeRhs(r, R(0.0));
      }
      else if(_realLP->rhs(r) < realParam(SoPlexBase<R>::INFTY))
         _realLP->changeRhs(r, realParam(SoPlexBase<R>::INFTY));
   }

   // transform objective function to constraint and add auxiliary variable
   int numOrigCols = numColsRational();
   DSVectorRational obj(numOrigCols + 1);
   ///@todo implement this without copying the objective function
   obj = _rationalLP->maxObj();
   obj.add(numOrigCols, -1);
   _rationalLP->addRow(LPRowRational(0, obj, 0));
   _realLP->addRow(LPRowBase<R>(0, DSVectorBase<R>(obj), 0));
   _rowTypes.append(RANGETYPE_FIXED);

   assert(numColsRational() == numOrigCols + 1);

   // set objective coefficient and bounds for auxiliary variable
   _rationalLP->changeMaxObj(numOrigCols, Rational(1));
   _realLP->changeMaxObj(numOrigCols, R(1.0));

   _rationalLP->changeBounds(numOrigCols, _rationalNegInfty, 1);
   _realLP->changeBounds(numOrigCols, -realParam(SoPlexBase<R>::INFTY), 1.0);
   _colTypes.append(RANGETYPE_UPPER);

   // set objective coefficients to zero and adjust bounds for problem variables
   for(int c = numColsRational() - 2; c >= 0; c--)
   {
      _rationalLP->changeObj(c, Rational(0));
      _realLP->changeObj(c, R(0.0));

      assert((lowerRational(c) > _rationalNegInfty) == _lowerFinite(_colTypes[c]));

      if(_lowerFinite(_colTypes[c]))
      {
         _rationalLP->changeLower(c, Rational(0));
         _realLP->changeLower(c, R(0.0));
      }
      else if(_realLP->lower(c) > -realParam(SoPlexBase<R>::INFTY))
         _realLP->changeLower(c, -realParam(SoPlexBase<R>::INFTY));

      assert((upperRational(c) < _rationalPosInfty) == _upperFinite(_colTypes[c]));

      if(_upperFinite(_colTypes[c]))
      {
         _rationalLP->changeUpper(c, Rational(0));
         _realLP->changeUpper(c, R(0.0));
      }
      else if(_realLP->upper(c) < realParam(SoPlexBase<R>::INFTY))
         _realLP->changeUpper(c, realParam(SoPlexBase<R>::INFTY));
   }

   // adjust basis
   if(_hasBasis)
   {
      _basisStatusCols.append(SPxSolverBase<R>::ON_UPPER);
      _basisStatusRows.append(SPxSolverBase<R>::BASIC);
      _rationalLUSolver.clear();
   }

   // print LP if in debug mode
   SPX_DEBUG(_realLP->writeFileLPBase("afterTransUnbounded.lp", 0, 0, 0));

   // stop timing
   _statistics->transformTime->stop();
}